

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int mbedtls_ecjpake_read_round_one(mbedtls_ecjpake_context *ctx,uchar *buf,size_t len)

{
  mbedtls_ecp_point *G;
  char *id;
  int iVar1;
  uchar *end;
  uchar *local_40;
  uchar *p;
  
  p._4_4_ = ctx->md_type;
  p._0_4_ = ctx->point_format;
  G = &(ctx->grp).G;
  id = ecjpake_id[1 - ctx->role];
  end = buf + len;
  local_40 = buf;
  iVar1 = ecjpake_kkp_read(p._4_4_,&ctx->grp,(int)p,G,&ctx->Xp1,id,&local_40,end);
  if (iVar1 == 0) {
    iVar1 = ecjpake_kkp_read(p._4_4_,&ctx->grp,(int)p,G,&ctx->Xp2,id,&local_40,end);
    if ((iVar1 == 0) && (iVar1 = -0x4f80, local_40 == end)) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_read_round_one(mbedtls_ecjpake_context *ctx,
                                   const unsigned char *buf,
                                   size_t len)
{
    return ecjpake_kkpp_read(ctx->md_type, &ctx->grp, ctx->point_format,
                             &ctx->grp.G,
                             &ctx->Xp1, &ctx->Xp2, ID_PEER,
                             buf, len);
}